

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTransaction::SetElementsTxState(ConfidentialTransaction *this)

{
  int iVar1;
  long lVar2;
  wally_tx_input *input;
  uint32_t i;
  int ret;
  size_t is_coinbase;
  wally_tx *tx_pointer;
  ConfidentialTransaction *this_local;
  
  is_coinbase = (size_t)(this->super_AbstractTransaction).wally_tx_pointer_;
  if ((void *)is_coinbase != (void *)0x0) {
    _i = 0;
    tx_pointer = (wally_tx *)this;
    iVar1 = wally_tx_is_coinbase(is_coinbase,&i);
    if ((iVar1 == 0) && (_i == 0)) {
      for (input._0_4_ = 0; (ulong)(uint)input < *(ulong *)(is_coinbase + 0x10);
          input._0_4_ = (uint)input + 1) {
        lVar2 = *(long *)(is_coinbase + 8) + (ulong)(uint)input * 0xd0;
        if ((*(long *)(lVar2 + 200) == 0) || (*(long *)(*(long *)(lVar2 + 200) + 8) == 0)) {
          *(byte *)(lVar2 + 0x40) = *(byte *)(lVar2 + 0x40) & 0xfb;
        }
        else {
          *(byte *)(lVar2 + 0x40) = *(byte *)(lVar2 + 0x40) | 4;
        }
        if (((*(long *)(lVar2 + 0x88) == 0) || (*(long *)(lVar2 + 0x90) == 0)) &&
           ((*(long *)(lVar2 + 0x98) == 0 || (*(long *)(lVar2 + 0xa0) == 0)))) {
          *(byte *)(lVar2 + 0x40) = *(byte *)(lVar2 + 0x40) & 0xfd;
        }
        else {
          *(byte *)(lVar2 + 0x40) = *(byte *)(lVar2 + 0x40) | 2;
        }
      }
    }
  }
  return;
}

Assistant:

void ConfidentialTransaction::SetElementsTxState() {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer != nullptr) {
    size_t is_coinbase = 0;
    // coinbase priority when coinbase is set
    int ret = wally_tx_is_coinbase(tx_pointer, &is_coinbase);
    if ((ret == WALLY_OK) && (is_coinbase == 0)) {
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        struct wally_tx_input *input = tx_pointer->inputs + i;
        // pegin_witness
        if ((input->pegin_witness != nullptr) &&
            (input->pegin_witness->num_items != 0)) {
          input->features |= kTxInFeaturePegin;
        } else {
          input->features &= ~kTxInFeaturePegin;
        }

        // issuance
        if (((input->issuance_amount != nullptr) &&
             (input->issuance_amount_len != 0)) ||
            ((input->inflation_keys != nullptr) &&
             (input->inflation_keys_len != 0))) {
          input->features |= kTxInFeatureIssuance;
        } else {
          input->features &= ~kTxInFeatureIssuance;
        }
      }
    }
  }
}